

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O1

bool deqp::gls::FboUtil::checkExtensionSupport
               (ContextInfo *ctxInfo,RenderContext *ctx,string *extension)

{
  bool bVar1;
  int iVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  int requiredMajor;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"GL_","");
  bVar1 = de::beginsWith(extension,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    bVar1 = glu::ContextInfo::isExtensionSupported(ctxInfo,(extension->_M_dataplus)._M_p);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)extension);
    if (iVar2 == 0) {
      requiredMajor = 0;
      iVar2 = extraout_EDX;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)extension);
      if (iVar2 != 0) {
        return false;
      }
      requiredMajor = 1;
      iVar2 = extraout_EDX_00;
    }
    bVar1 = detectGLESCompatibleContext(ctx,requiredMajor,iVar2);
  }
  return bVar1;
}

Assistant:

static bool checkExtensionSupport (const ContextInfo& ctxInfo, const RenderContext& ctx, const std::string& extension)
{
	if (de::beginsWith(extension, "GL_"))
		return ctxInfo.isExtensionSupported(extension.c_str());
	else if (extension == "DEQP_gles3_core_compatible")
		return detectGLESCompatibleContext(ctx, 3, 0);
	else if (extension == "DEQP_gles31_core_compatible")
		return detectGLESCompatibleContext(ctx, 3, 1);
	else
	{
		DE_ASSERT(false);
		return false;
	}
}